

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_kj::String,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:522:11),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_kj::String,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:522:11),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  char *in_RCX;
  InitializeableArray<kj::StringPtr> *arr;
  long lVar9;
  char *__s2;
  Exception *this_00;
  char *__s1;
  char *ptrCopy;
  bool bVar10;
  ExceptionOr<kj::String> depResult;
  Exception local_5c8;
  ExceptionOrValue local_470;
  char local_310;
  char *local_308;
  size_t sStack_300;
  ArrayDisposer *local_2f8;
  ExceptionOrValue local_2f0;
  char local_190;
  Exception local_188;
  
  local_470.exception.ptr.isSet = false;
  local_310 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_470);
  uVar7 = local_470.exception.ptr.field_1.value.context.ptr.ptr;
  uVar6 = local_470.exception.ptr.field_1.value.description.content.size_;
  uVar5 = local_470.exception.ptr.field_1.value.description.content.ptr;
  uVar4 = local_470.exception.ptr.field_1.value.ownFile.content.size_;
  uVar3 = local_470.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_470.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_470.exception.ptr.field_1 + 0x50);
    local_5c8.ownFile.content.ptr = local_470.exception.ptr.field_1.value.ownFile.content.ptr;
    local_5c8.ownFile.content.size_ = local_470.exception.ptr.field_1.value.ownFile.content.size_;
    local_5c8.ownFile.content.disposer =
         local_470.exception.ptr.field_1.value.ownFile.content.disposer;
    local_470.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_470.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_5c8.file = local_470.exception.ptr.field_1.value.file;
    local_5c8.line = local_470.exception.ptr.field_1.value.line;
    local_5c8.type = local_470.exception.ptr.field_1.value.type;
    local_5c8.description.content.ptr =
         local_470.exception.ptr.field_1.value.description.content.ptr;
    local_5c8.description.content.size_ =
         local_470.exception.ptr.field_1.value.description.content.size_;
    local_5c8.description.content.disposer =
         local_470.exception.ptr.field_1.value.description.content.disposer;
    local_470.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_470.exception.ptr.field_1.value.description.content.size_ = 0;
    local_5c8.context.ptr.disposer = local_470.exception.ptr.field_1.value.context.ptr.disposer;
    local_5c8.context.ptr.ptr = local_470.exception.ptr.field_1.value.context.ptr.ptr;
    local_470.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_5c8.trace,__src,0x104);
    local_188.ownFile.content.ptr = (char *)uVar3;
    local_188.ownFile.content.size_ = uVar4;
    local_188.ownFile.content.disposer =
         local_470.exception.ptr.field_1.value.ownFile.content.disposer;
    local_5c8.ownFile.content.ptr = (char *)0x0;
    local_5c8.ownFile.content.size_ = 0;
    local_188.file = local_470.exception.ptr.field_1.value.file;
    local_188.line = local_470.exception.ptr.field_1.value.line;
    local_188.type = local_470.exception.ptr.field_1.value.type;
    local_188.description.content.ptr = (char *)uVar5;
    local_188.description.content.size_ = uVar6;
    local_188.description.content.disposer =
         local_470.exception.ptr.field_1.value.description.content.disposer;
    local_5c8.description.content.ptr = (char *)0x0;
    local_5c8.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_470.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = (Context *)uVar7;
    local_5c8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_2f0.exception.ptr.isSet = true;
    local_2f0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar3;
    local_2f0.exception.ptr.field_1.value.ownFile.content.size_ = uVar4;
    local_2f0.exception.ptr.field_1.value.ownFile.content.disposer =
         local_470.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_2f0.exception.ptr.field_1.value.file = local_470.exception.ptr.field_1.value.file;
    local_2f0.exception.ptr.field_1._32_8_ = local_470.exception.ptr.field_1._32_8_;
    local_2f0.exception.ptr.field_1.value.description.content.ptr = (char *)uVar5;
    local_2f0.exception.ptr.field_1.value.description.content.size_ = uVar6;
    local_2f0.exception.ptr.field_1.value.description.content.disposer =
         local_470.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_2f0.exception.ptr.field_1.value.context.ptr.disposer =
         local_470.exception.ptr.field_1.value.context.ptr.disposer;
    local_2f0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar7;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_2f0.exception.ptr.field_1 + 0x50),__src,0x104);
    local_190 = '\0';
    Exception::~Exception(&local_188);
    ExceptionOrValue::operator=(output,&local_2f0);
    if (&local_2f0 != output) {
      if (output[1].exception.ptr.isSet == true) {
        output[1].exception.ptr.isSet = false;
      }
      if (local_190 == '\x01') {
        output[1].exception.ptr.isSet = true;
      }
    }
    if (local_2f0.exception.ptr.isSet == true) {
      Exception::~Exception(&local_2f0.exception.ptr.field_1.value);
    }
    this_00 = &local_5c8;
  }
  else {
    if (local_310 != '\x01') goto LAB_0027624b;
    local_5c8.ownFile.content.ptr = local_308;
    local_5c8.ownFile.content.size_ = sStack_300;
    local_5c8.ownFile.content.disposer = local_2f8;
    local_308 = (char *)0x0;
    sStack_300 = 0;
    strArray<kj::(anonymous_namespace)::InitializeableArray<kj::StringPtr>const&>
              (&local_188.ownFile,(kj *)&((this->func).testCase)->responseBodyParts,arr,in_RCX);
    sVar2 = local_188.ownFile.content.size_;
    pcVar1 = local_188.ownFile.content.ptr;
    lVar9 = local_5c8.ownFile.content.size_ + (local_5c8.ownFile.content.size_ == 0);
    bVar10 = true;
    if (lVar9 == local_188.ownFile.content.size_ + (local_188.ownFile.content.size_ == 0)) {
      __s2 = local_188.ownFile.content.ptr;
      if (local_188.ownFile.content.size_ == 0) {
        __s2 = "";
      }
      __s1 = "";
      if (local_5c8.ownFile.content.size_ != 0) {
        __s1 = local_5c8.ownFile.content.ptr;
      }
      iVar8 = bcmp(__s1,__s2,lVar9 - 1);
      bVar10 = iVar8 != 0;
    }
    if (pcVar1 != (char *)0x0) {
      local_188.ownFile.content.ptr = (char *)0x0;
      local_188.ownFile.content.size_ = 0;
      (**(local_188.ownFile.content.disposer)->_vptr_ArrayDisposer)
                (local_188.ownFile.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
    if ((bool)(bVar10 & Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[70],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x20b,ERROR,
                 "\"failed: expected \" \"body == kj::strArray(testCase.responseBodyParts, \\\"\\\")\", body"
                 ,(char (*) [70])
                  "failed: expected body == kj::strArray(testCase.responseBodyParts, \"\")",
                 &local_5c8.ownFile);
    }
    sVar2 = local_5c8.ownFile.content.size_;
    pcVar1 = local_5c8.ownFile.content.ptr;
    if (local_5c8.ownFile.content.ptr != (char *)0x0) {
      local_5c8.ownFile.content.ptr = (char *)0x0;
      local_5c8.ownFile.content.size_ = 0;
      (**(local_5c8.ownFile.content.disposer)->_vptr_ArrayDisposer)
                (local_5c8.ownFile.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
    local_2f0.exception.ptr.isSet = false;
    local_190 = '\x01';
    ExceptionOrValue::operator=(output,&local_2f0);
    if (&local_2f0 != output) {
      if (output[1].exception.ptr.isSet == true) {
        output[1].exception.ptr.isSet = false;
      }
      if (local_190 == '\x01') {
        output[1].exception.ptr.isSet = true;
      }
    }
    if (local_2f0.exception.ptr.isSet != true) goto LAB_0027624b;
    this_00 = (Exception *)&local_2f0.exception.ptr.field_1;
  }
  Exception::~Exception(this_00);
LAB_0027624b:
  sVar2 = sStack_300;
  pcVar1 = local_308;
  if ((local_310 == '\x01') && (local_308 != (char *)0x0)) {
    local_308 = (char *)0x0;
    sStack_300 = 0;
    (**local_2f8->_vptr_ArrayDisposer)(local_2f8,pcVar1,1,sVar2,sVar2,0);
  }
  if (local_470.exception.ptr.isSet == true) {
    Exception::~Exception(&local_470.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }